

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeTreeInterfaces.cpp
# Opt level: O3

void __thiscall
Indexing::CodeTreeTIS<Indexing::TermLiteralClause>::ResultIterator::ResultIterator
          (ResultIterator *this,CodeTreeTIS<Indexing::TermLiteralClause> *tree,TermList t,
          bool retrieveSubstitutions)

{
  _Head_base<0UL,_Kernel::Renaming_*,_false> _Var1;
  _Head_base<0UL,_Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher_*,_false> _Var2;
  CodeTreeSubstitution<Indexing::TermLiteralClause> *pCVar3;
  
  (this->
  super_IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>
  )._refCnt = 0;
  (this->
  super_IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>
  )._vptr_IteratorCore = (_func_int **)&PTR__ResultIterator_00b293e0;
  Lib::Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::Recycled
            (&this->_resultNormalizer);
  this->_retrieveSubstitutions = retrieveSubstitutions;
  this->_found = (TermLiteralClause *)0x0;
  this->_finished = false;
  this->_tree = tree;
  Lib::
  Recycled<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled(&this->_matcher);
  TermCodeTree<Indexing::TermLiteralClause>::TermMatcher::init
            ((this->_matcher)._self._M_t.
             super___uniq_ptr_impl<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher>_>
             ._M_t.
             super__Tuple_impl<0UL,_Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher_*,_std::default_delete<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher>_>
             .
             super__Head_base<0UL,_Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher_*,_false>
             ._M_head_impl,(EVP_PKEY_CTX *)&this->_tree->_ct);
  if (this->_retrieveSubstitutions == true) {
    pCVar3 = (CodeTreeSubstitution<Indexing::TermLiteralClause> *)
             Lib::FixedSizeAllocator<24UL>::alloc
                       ((FixedSizeAllocator<24UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
    _Var1._M_head_impl =
         (this->_resultNormalizer)._self._M_t.
         super___uniq_ptr_impl<Kernel::Renaming,_std::default_delete<Kernel::Renaming>_>._M_t.
         super__Tuple_impl<0UL,_Kernel::Renaming_*,_std::default_delete<Kernel::Renaming>_>.
         super__Head_base<0UL,_Kernel::Renaming_*,_false>._M_head_impl;
    _Var2._M_head_impl =
         (this->_matcher)._self._M_t.
         super___uniq_ptr_impl<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher>_>
         ._M_t.
         super__Tuple_impl<0UL,_Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher_*,_std::default_delete<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher>_>
         .
         super__Head_base<0UL,_Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher_*,_false>
         ._M_head_impl;
    (pCVar3->super_ResultSubstitution)._vptr_ResultSubstitution =
         (_func_int **)&PTR__ResultSubstitution_00b29698;
    pCVar3->_bindings = (BindingArray *)((long)&(_Var2._M_head_impl)->super_Matcher + 0x18);
    pCVar3->_resultNormalizer = _Var1._M_head_impl;
    this->_subst = pCVar3;
  }
  return;
}

Assistant:

ResultIterator(CodeTreeTIS* tree, TermList t, bool retrieveSubstitutions)
  : _retrieveSubstitutions(retrieveSubstitutions),
    _found(0), _finished(false), _tree(tree)
  {
    _matcher->init(&_tree->_ct, t);

    if(_retrieveSubstitutions) {
      _subst = new CodeTreeSubstitution<Data>(&_matcher->bindings, &*_resultNormalizer);
    }
  }